

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarrisCorner.cpp
# Opt level: O0

void localMaxima(Mat *cNorm,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners,
                int threshold)

{
  float fVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  Point_<int> local_260;
  Point2f local_258;
  undefined1 local_250 [8];
  KeyPoint kPoint;
  float intensity_1;
  int j_2;
  int i_2;
  float current;
  int n;
  int m;
  int col;
  int row;
  float max;
  int j_1;
  int i_1;
  float intensity;
  int j;
  int i;
  int cols;
  int rows;
  MatSize local_1e8 [8];
  MatExpr local_1e0 [352];
  MatExpr local_80 [8];
  Mat cThreshold;
  int local_74;
  int threshold_local;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners_local;
  Mat *cNorm_local;
  
  cv::MatSize::operator()(local_1e8);
  cv::Mat::zeros(local_1e0,local_1e8,5);
  cv::MatExpr::operator_cast_to_Mat(local_80);
  cv::MatExpr::~MatExpr(local_1e0);
  iVar2 = *(int *)(cNorm + 8);
  iVar3 = *(int *)(cNorm + 0xc);
  for (intensity = 0.0; (int)intensity < iVar2; intensity = (float)((int)intensity + 1)) {
    for (i_1 = 0; i_1 < iVar3; i_1 = i_1 + 1) {
      pfVar4 = cv::Mat::at<float>(cNorm,(int)intensity,i_1);
      fVar1 = *pfVar4;
      if ((float)threshold <= fVar1) {
        pfVar4 = cv::Mat::at<float>((Mat *)local_80,(int)intensity,i_1);
        *pfVar4 = fVar1;
      }
    }
  }
  for (max = 1.4013e-45; (int)max < _cThreshold + -2; max = (float)((int)max + 1)) {
    for (row = 1; row < local_74 + -2; row = row + 1) {
      col = 0;
      m = -1;
      n = -1;
      for (current = -NAN; (int)current < 2; current = (float)((int)current + 1)) {
        for (i_2 = -1; i_2 < 2; i_2 = i_2 + 1) {
          pfVar4 = cv::Mat::at<float>((Mat *)local_80,(int)max + (int)current,row + i_2);
          fVar1 = *pfVar4;
          if (((fVar1 == 0.0) && (!NAN(fVar1))) || (fVar1 < (float)col)) {
            pfVar4 = cv::Mat::at<float>((Mat *)local_80,(int)max + (int)current,row + i_2);
            *pfVar4 = 0.0;
          }
          else {
            if (m != -1) {
              pfVar4 = cv::Mat::at<float>((Mat *)local_80,m,n);
              *pfVar4 = 0.0;
            }
            m = (int)max + (int)current;
            n = row + i_2;
            col = (int)fVar1;
          }
        }
      }
    }
  }
  for (intensity_1 = 0.0; (int)intensity_1 < iVar2; intensity_1 = (float)((int)intensity_1 + 1)) {
    for (kPoint.class_id = 0; kPoint.class_id < iVar3; kPoint.class_id = kPoint.class_id + 1) {
      pfVar4 = cv::Mat::at<float>((Mat *)local_80,(int)intensity_1,kPoint.class_id);
      kPoint.octave = (int)*pfVar4;
      if (((float)kPoint.octave != 0.0) || (NAN((float)kPoint.octave))) {
        cv::Point_<int>::Point_(&local_260,kPoint.class_id,(int)intensity_1);
        cv::Point_::operator_cast_to_Point_((Point_ *)&local_258);
        cv::KeyPoint::KeyPoint((KeyPoint *)local_250,&local_258,5.0,-1.0,(float)kPoint.octave,0,-1);
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::push_back
                  (corners,(value_type *)local_250);
      }
    }
  }
  cv::Mat::~Mat((Mat *)local_80);
  return;
}

Assistant:

void localMaxima(const cv::Mat& cNorm, std::vector<KeyPoint>& corners, int threshold) {

	Mat cThreshold = Mat::zeros(cNorm.size(), CV_32F);

	int rows = cNorm.rows;
	int cols = cNorm.cols;
	for (int i = 0; i < rows; ++i) {
		for (int j = 0; j < cols; ++j) {
			float intensity = cNorm.at<float>(i, j);
			if (intensity >= threshold) {
				cThreshold.at<float>(i, j) = intensity;
			}
		}
	}

	for (int i = 1; i < cThreshold.rows - 2; ++i) {
		for (int j = 1; j < cThreshold.cols - 2; ++j) {
			//loop within 3*3 box
			float max = 0;
			int row=-1, col=-1;
			for (int m = -1; m < 2; ++m) {
				for (int n = -1; n < 2; ++n) {
					float current = cThreshold.at<float>(i+m, j+n);
					if (current!=0 && current >= max) {
						max = current;
						//set previous max to 0
						if (row != -1) cThreshold.at<float>(row, col) = 0.0F;
						row = i + m;
						col = j + n;
					}
					else {
						cThreshold.at<float>(i+m,j+n) = 0.0F;
					}
				}
			}

		}
	}

	for (int i = 0; i < rows; ++i) {
		for (int j = 0; j < cols; ++j) {
			float intensity = cThreshold.at<float>(i, j);
			if (intensity != 0) {
				KeyPoint kPoint(Point(j, i), 5, -1.0F, intensity);
				corners.push_back(kPoint);
			}
		}
	}

}